

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles31::Functional::createCopyImageTests(Context *context)

{
  TestCaseGroup *this;
  Context *context_local;
  
  this = (TestCaseGroup *)operator_new(0x78);
  anon_unknown_0::CopyImageTests::CopyImageTests((CopyImageTests *)this,context);
  return this;
}

Assistant:

TestCaseGroup* createCopyImageTests (Context& context)
{
	return new CopyImageTests(context);
}